

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInputImage.cpp
# Opt level: O1

void readInputImage(char *inFileName,float padTop,float padBottom,Envmap overrideType,bool verbose,
                   EnvmapImage *image,Header *header,RgbaChannels *channels)

{
  int iVar1;
  char cVar2;
  int iVar3;
  RgbaChannels RVar4;
  char *pcVar5;
  long *plVar6;
  ostream *poVar7;
  int *piVar8;
  Header *pHVar9;
  Array2D<Imf_3_4::Rgba> *pAVar10;
  size_t sVar11;
  Envmap *pEVar12;
  InputExc *pIVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  Envmap type;
  long lVar17;
  int iVar18;
  ulong uVar19;
  Rgba *pRVar20;
  int iVar21;
  float fVar22;
  int iVar23;
  uint uVar24;
  string name;
  string name_1;
  RgbaInputFile in;
  stringstream _iex_throw_s;
  Box2i imageDw;
  long *local_278;
  long local_270;
  long local_268 [2];
  float local_258;
  long *local_240;
  long local_238;
  long local_230 [2];
  long local_220;
  Rgba local_218 [8];
  long local_1d8;
  ulong local_1d0;
  Box2i local_1c8;
  long local_1b8 [47];
  Box2i local_40;
  
  local_258 = padTop;
  pcVar5 = strchr(inFileName,0x25);
  if (pcVar5 == (char *)0x0) {
    local_278 = (long *)CONCAT44(local_278._4_4_,overrideType);
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,inFileName,iVar3);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
      if (inFileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e190);
      }
      else {
        sVar11 = strlen(inFileName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,inFileName,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    pHVar9 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar9);
    RVar4 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar4;
    type = (Envmap)local_278;
    if ((Envmap)local_278 < NUM_ENVMAPTYPES) {
      Imf_3_4::addEnvmap(header,(Envmap *)&local_278);
    }
    else {
      pHVar9 = (Header *)Imf_3_4::RgbaInputFile::header();
      cVar2 = Imf_3_4::hasEnvmap(pHVar9);
      type = ENVMAP_LATLONG;
      if (cVar2 != '\0') {
        pHVar9 = (Header *)Imf_3_4::RgbaInputFile::header();
        pEVar12 = (Envmap *)Imf_3_4::envmap(pHVar9);
        type = *pEVar12;
        if (ENVMAP_CUBE < type) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"unknown envmap type ",0x14);
          std::ostream::operator<<((ostream *)local_1b8,*pEVar12);
          pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar13,(stringstream *)&local_1c8);
          __cxa_throw(pIVar13,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
      }
    }
    piVar8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar16 = piVar8[3];
    iVar18 = piVar8[1];
    iVar3 = (iVar16 - iVar18) + 1;
    iVar23 = 0;
    uVar24 = 0;
    if (type == ENVMAP_LATLONG) {
      fVar22 = (float)iVar3;
      iVar23 = (int)(fVar22 * padBottom + 0.5);
      uVar24 = (uint)(fVar22 * local_258 + 0.5);
    }
    iVar1 = *piVar8;
    iVar21 = piVar8[2];
    local_1c8.min.x = *piVar8;
    local_1c8.min.y = piVar8[1] - uVar24;
    local_1c8.max.x = piVar8[2];
    local_1c8.max.y = piVar8[3] + iVar23;
    local_258 = (float)iVar23;
    EnvmapImage::resize(image,type,&local_1c8);
    pAVar10 = EnvmapImage::pixels(image);
    iVar21 = iVar21 - iVar1;
    Imf_3_4::RgbaInputFile::setFrameBuffer
              (local_218,
               (ulong)(pAVar10->_data +
                      (-(long)local_1c8.min.y * pAVar10->_sizeY - (long)local_1c8.min.x)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)local_218,piVar8[1]);
    if (0 < (int)uVar24) {
      lVar17 = 0;
      uVar15 = 0;
      do {
        if (-1 < iVar21) {
          uVar19 = 0;
          do {
            *(Rgba *)((long)&pAVar10->_data[uVar19].r._h + lVar17 * pAVar10->_sizeY) =
                 pAVar10->_data[pAVar10->_sizeY * (ulong)uVar24 + uVar19];
            uVar19 = uVar19 + 1;
          } while (iVar21 + 1 != uVar19);
        }
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 8;
      } while (uVar15 != uVar24);
    }
    if (0 < (int)local_258) {
      iVar3 = iVar3 + uVar24;
      lVar14 = (long)iVar3;
      lVar17 = lVar14 * 8;
      do {
        if (-1 < iVar21) {
          uVar15 = 0;
          do {
            *(Rgba *)((long)&pAVar10->_data[uVar15].r._h + lVar17 * pAVar10->_sizeY) =
                 pAVar10->_data[pAVar10->_sizeY * (long)(int)((iVar16 - iVar18) + uVar24) + uVar15];
            uVar15 = uVar15 + 1;
          } while (iVar21 + 1 != uVar15);
        }
        lVar14 = lVar14 + 1;
        lVar17 = lVar17 + 8;
      } while (lVar14 < (int)local_258 + iVar3);
    }
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,inFileName,(allocator<char> *)local_218);
    local_1d0 = (long)pcVar5 - (long)inFileName;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,local_1d0,(char *)0x1,0x10a272)
    ;
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char*>((string *)&local_278,*plVar6,plVar6[1] + *plVar6);
    if ((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x) != local_1b8) {
      operator_delete((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x),local_1b8[0] + 1);
    }
    plVar6 = local_278;
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,(char *)plVar6,iVar3);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"reading cube face size from file ",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_278,local_270);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    piVar8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    local_220 = (long)*piVar8;
    iVar3 = piVar8[1];
    uVar24 = piVar8[2];
    local_258 = (float)piVar8[3];
    iVar18 = uVar24 - *piVar8;
    iVar16 = (int)local_258 - iVar3;
    if (iVar18 != iVar16) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,"Cube face image ",0x10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1b8,(char *)local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," is not square.",0xf);
      pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(pIVar13,(stringstream *)&local_1c8);
      __cxa_throw(pIVar13,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    pHVar9 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar9);
    RVar4 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar4;
    local_1c8.min.x = 1;
    Imf_3_4::addEnvmap(header,(Envmap *)&local_1c8);
    iVar16 = iVar16 + 1;
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
    local_40.max.y = iVar16 * 6 + -1;
    local_40.min.x = 0;
    local_40.min.y = 0;
    local_40.max.x = iVar18;
    EnvmapImage::resize(image,ENVMAP_CUBE,&local_40);
    pAVar10 = EnvmapImage::pixels(image);
    pRVar20 = pAVar10->_data + (((int)~uVar24 + local_220) * (long)iVar3 - local_220);
    local_1d8 = (long)(iVar16 * (iVar18 + 1)) << 3;
    lVar17 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,inFileName,(allocator<char> *)local_218);
      pcVar5 = *(char **)((long)&(anonymous_namespace)::
                                 readSixImages(char_const*,bool,EnvmapImage&,Imf_3_4::Header&,Imf_3_4::RgbaChannels&)
                                 ::faceNames + lVar17);
      strlen(pcVar5);
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_1c8,local_1d0,(char *)0x1,(ulong)pcVar5);
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char*>((string *)&local_240,*plVar6,plVar6[1] + *plVar6);
      if ((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x) != local_1b8) {
        operator_delete((long *)CONCAT44(local_1c8.min.y,local_1c8.min.x),local_1b8[0] + 1);
      }
      plVar6 = local_240;
      iVar16 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_218,(char *)plVar6,iVar16);
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"reading file ",0xd);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_240,local_238);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      piVar8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
      if ((((*piVar8 != (int)local_220) || (piVar8[1] != iVar3)) || (piVar8[2] != uVar24)) ||
         ((float)piVar8[3] != local_258)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"The data window of cube face ",0x1d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,(char *)local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," differs from the data window of other cube faces.",0x32);
        pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar13,(stringstream *)&local_1c8);
        __cxa_throw(pIVar13,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      Imf_3_4::RgbaInputFile::setFrameBuffer(local_218,(ulong)pRVar20,1);
      Imf_3_4::RgbaInputFile::readPixels((int)local_218,iVar3);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_218);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      lVar17 = lVar17 + 8;
      pRVar20 = (Rgba *)((long)&(pRVar20->r)._h + local_1d8);
    } while (lVar17 != 0x30);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  return;
}

Assistant:

void
readInputImage (
    const char    inFileName[],
    float         padTop,
    float         padBottom,
    Envmap        overrideType,
    bool          verbose,
    EnvmapImage&  image,
    Header&       header,
    RgbaChannels& channels)
{
    if (strchr (inFileName, '%'))
    {
        readSixImages (inFileName, verbose, image, header, channels);
    }
    else
    {
        readSingleImage (
            inFileName,
            padTop,
            padBottom,
            overrideType,
            verbose,
            image,
            header,
            channels);
    }
}